

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::type_caster<signed_char,_void>::cast
                 (char src,return_value_policy param_2,handle param_3)

{
  PyObject *ptr;
  return_value_policy param_1_local;
  char src_local;
  handle param_2_local;
  
  ptr = (PyObject *)PyLong_FromLong((long)src);
  handle::handle(&param_2_local,ptr);
  return (handle)param_2_local.m_ptr;
}

Assistant:

static handle cast(T src, return_value_policy /* policy */, handle /* parent */) {
        if (std::is_floating_point<T>::value) {
            return PyFloat_FromDouble((double) src);
        } else if (sizeof(T) <= sizeof(long)) {
            if (std::is_signed<T>::value)
                return PyLong_FromLong((long) src);
            else
                return PyLong_FromUnsignedLong((unsigned long) src);
        } else {
            if (std::is_signed<T>::value)
                return PyLong_FromLongLong((long long) src);
            else
                return PyLong_FromUnsignedLongLong((unsigned long long) src);
        }
    }